

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_connect(Curl_easy *data,_Bool *done)

{
  undefined1 *puVar1;
  connectdata *conn;
  long lVar2;
  uint uVar3;
  int iVar4;
  tftp_state_data *state;
  uchar *puVar5;
  int *piVar6;
  char *pcVar7;
  CURLcode CVar8;
  uint uVar9;
  char buffer [256];
  
  conn = data->conn;
  state = (tftp_state_data *)(*Curl_ccalloc)(1,0x160);
  (conn->proto).tftpc = state;
  CVar8 = CURLE_OUT_OF_MEMORY;
  if (state != (tftp_state_data *)0x0) {
    lVar2 = (data->set).tftp_blksize;
    uVar9 = (uint)lVar2;
    if (lVar2 == 0) {
      uVar9 = 0x200;
    }
    uVar3 = 0x200;
    if (0x200 < (int)uVar9) {
      uVar3 = uVar9;
    }
    if ((state->rpacket).data == (uchar *)0x0) {
      puVar5 = (uchar *)(*Curl_ccalloc)(1,(long)uVar3 + 4);
      (state->rpacket).data = puVar5;
      if (puVar5 == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if ((state->spacket).data == (uchar *)0x0) {
      puVar5 = (uchar *)(*Curl_ccalloc)(1,(long)uVar3 + 4);
      (state->spacket).data = puVar5;
      if (puVar5 == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    Curl_conncontrol(conn,1);
    state->data = data;
    state->sockfd = conn->sock[0];
    state->state = TFTP_STATE_START;
    state->error = TFTP_ERR_NONE;
    state->blksize = 0x200;
    state->requested_blksize = uVar9;
    (state->local_addr).buffer.sa.sa_family = (sa_family_t)conn->remote_addr->family;
    tftp_set_timeouts(state);
    if (((conn->bits).field_0x2 & 0x10) == 0) {
      iVar4 = bind(state->sockfd,(sockaddr *)&state->local_addr,conn->remote_addr->addrlen);
      if (iVar4 != 0) {
        piVar6 = __errno_location();
        pcVar7 = Curl_strerror(*piVar6,buffer,0x100);
        Curl_failf(data,"bind() failed; %s",pcVar7);
        return CURLE_COULDNT_CONNECT;
      }
      puVar1 = &(conn->bits).field_0x2;
      *puVar1 = *puVar1 | 0x10;
    }
    Curl_pgrsStartNow(data);
    *done = true;
    CVar8 = CURLE_OK;
  }
  return CVar8;
}

Assistant:

static CURLcode tftp_connect(struct Curl_easy *data, bool *done)
{
  struct tftp_state_data *state;
  int blksize;
  int need_blksize;
  struct connectdata *conn = data->conn;

  blksize = TFTP_BLKSIZE_DEFAULT;

  state = conn->proto.tftpc = calloc(1, sizeof(struct tftp_state_data));
  if(!state)
    return CURLE_OUT_OF_MEMORY;

  /* alloc pkt buffers based on specified blksize */
  if(data->set.tftp_blksize)
    /* range checked when set */
    blksize = (int)data->set.tftp_blksize;

  need_blksize = blksize;
  /* default size is the fallback when no OACK is received */
  if(need_blksize < TFTP_BLKSIZE_DEFAULT)
    need_blksize = TFTP_BLKSIZE_DEFAULT;

  if(!state->rpacket.data) {
    state->rpacket.data = calloc(1, need_blksize + 2 + 2);

    if(!state->rpacket.data)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!state->spacket.data) {
    state->spacket.data = calloc(1, need_blksize + 2 + 2);

    if(!state->spacket.data)
      return CURLE_OUT_OF_MEMORY;
  }

  /* we do not keep TFTP connections up basically because there is none or
   * little gain for UDP */
  connclose(conn, "TFTP");

  state->data = data;
  state->sockfd = conn->sock[FIRSTSOCKET];
  state->state = TFTP_STATE_START;
  state->error = TFTP_ERR_NONE;
  state->blksize = TFTP_BLKSIZE_DEFAULT; /* Unless updated by OACK response */
  state->requested_blksize = blksize;

  ((struct sockaddr *)&state->local_addr)->sa_family =
    (CURL_SA_FAMILY_T)(conn->remote_addr->family);

  tftp_set_timeouts(state);

  if(!conn->bits.bound) {
    /* If not already bound, bind to any interface, random UDP port. If it is
     * reused or a custom local port was desired, this has already been done!
     *
     * We once used the size of the local_addr struct as the third argument
     * for bind() to better work with IPv6 or whatever size the struct could
     * have, but we learned that at least Tru64, AIX and IRIX *requires* the
     * size of that argument to match the exact size of a 'sockaddr_in' struct
     * when running IPv4-only.
     *
     * Therefore we use the size from the address we connected to, which we
     * assume uses the same IP version and thus hopefully this works for both
     * IPv4 and IPv6...
     */
    int rc = bind(state->sockfd, (struct sockaddr *)&state->local_addr,
                  (curl_socklen_t)conn->remote_addr->addrlen);
    if(rc) {
      char buffer[STRERROR_LEN];
      failf(data, "bind() failed; %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      return CURLE_COULDNT_CONNECT;
    }
    conn->bits.bound = TRUE;
  }

  Curl_pgrsStartNow(data);

  *done = TRUE;

  return CURLE_OK;
}